

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiContext::ImGuiContext(ImGuiContext *this,ImFontAtlas *shared_font_atlas)

{
  void *pvVar1;
  void *in_RSI;
  undefined1 *in_RDI;
  ImFontAtlas *this_00;
  ImGuiNextWindowData *in_stack_fffffffffffffe70;
  void *local_188;
  ImPool<ImGuiTable> *in_stack_fffffffffffffe80;
  ImGuiInputTextState *in_stack_fffffffffffffe90;
  ImDrawListSharedData *in_stack_fffffffffffffea0;
  ImGuiIO *in_stack_fffffffffffffed0;
  ImGuiStyle *in_stack_fffffffffffffee0;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  undefined1 local_31;
  void *local_30;
  void *local_28;
  void *local_10;
  
  local_10 = in_RSI;
  ImGuiIO::ImGuiIO(in_stack_fffffffffffffed0);
  ImVector<ImGuiInputEvent>::ImVector((ImVector<ImGuiInputEvent> *)(in_RDI + 0x37d8));
  ImVector<ImGuiInputEvent>::ImVector((ImVector<ImGuiInputEvent> *)(in_RDI + 0x37e8));
  ImGuiStyle::ImGuiStyle(in_stack_fffffffffffffee0);
  ImDrawListSharedData::ImDrawListSharedData(in_stack_fffffffffffffea0);
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x3e48));
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x3e58));
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x3e68));
  ImVector<ImGuiWindowStackData>::ImVector((ImVector<ImGuiWindowStackData> *)(in_RDI + 0x3e78));
  ImGuiStorage::ImGuiStorage((ImGuiStorage *)0x13de84);
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x3e9c));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x3ed0));
  ImBitArray<133,_-512>::ImBitArray((ImBitArray<133,__512> *)0x13dec6);
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x3f24));
  ImGuiNextItemData::ImGuiNextItemData((ImGuiNextItemData *)0x13def2);
  ImGuiLastItemData::ImGuiLastItemData((ImGuiLastItemData *)in_stack_fffffffffffffe70);
  ImGuiNextWindowData::ImGuiNextWindowData(in_stack_fffffffffffffe70);
  ImVector<ImGuiColorMod>::ImVector((ImVector<ImGuiColorMod> *)(in_RDI + 0x4020));
  ImVector<ImGuiStyleMod>::ImVector((ImVector<ImGuiStyleMod> *)(in_RDI + 0x4030));
  ImVector<ImFont_*>::ImVector((ImVector<ImFont_*> *)(in_RDI + 0x4040));
  ImVector<unsigned_int>::ImVector((ImVector<unsigned_int> *)(in_RDI + 0x4050));
  ImVector<int>::ImVector((ImVector<int> *)(in_RDI + 0x4060));
  ImVector<ImGuiGroupData>::ImVector((ImVector<ImGuiGroupData> *)(in_RDI + 0x4070));
  ImVector<ImGuiPopupData>::ImVector((ImVector<ImGuiPopupData> *)(in_RDI + 0x4080));
  ImVector<ImGuiPopupData>::ImVector((ImVector<ImGuiPopupData> *)(in_RDI + 0x4090));
  ImVector<ImGuiViewportP_*>::ImVector((ImVector<ImGuiViewportP_*> *)(in_RDI + 0x40a8));
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffe70);
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffe70);
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffe70);
  ImGuiNavItemData::ImGuiNavItemData((ImGuiNavItemData *)in_stack_fffffffffffffe70);
  ImGuiNavItemData::ImGuiNavItemData((ImGuiNavItemData *)in_stack_fffffffffffffe70);
  ImGuiNavItemData::ImGuiNavItemData((ImGuiNavItemData *)in_stack_fffffffffffffe70);
  ImGuiNavItemData::ImGuiNavItemData((ImGuiNavItemData *)in_stack_fffffffffffffe70);
  ImGuiPayload::ImGuiPayload((ImGuiPayload *)0x13e0dc);
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffe70);
  ImVector<unsigned_char>::ImVector((ImVector<unsigned_char> *)(in_RDI + 0x42d0));
  ImVector<ImGuiListClipperData>::ImVector((ImVector<ImGuiListClipperData> *)(in_RDI + 0x42f8));
  ImVector<ImGuiTableTempData>::ImVector((ImVector<ImGuiTableTempData> *)(in_RDI + 0x4318));
  ImPool<ImGuiTable>::ImPool(in_stack_fffffffffffffe80);
  ImVector<float>::ImVector((ImVector<float> *)(in_RDI + 0x4350));
  ImVector<ImDrawChannel>::ImVector((ImVector<ImDrawChannel> *)(in_RDI + 0x4360));
  ImPool<ImGuiTabBar>::ImPool((ImPool<ImGuiTabBar> *)in_stack_fffffffffffffe80);
  ImVector<ImGuiPtrOrIndex>::ImVector((ImVector<ImGuiPtrOrIndex> *)(in_RDI + 0x43a0));
  ImVector<ImGuiShrinkWidthItem>::ImVector((ImVector<ImGuiShrinkWidthItem> *)(in_RDI + 0x43b0));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x43c0));
  ImGuiInputTextState::ImGuiInputTextState(in_stack_fffffffffffffe90);
  ImFont::ImFont((ImFont *)in_stack_fffffffffffffe90);
  ImVec4::ImVec4((ImVec4 *)(in_RDI + 0x52d4));
  ImGuiComboPreviewData::ImGuiComboPreviewData((ImGuiComboPreviewData *)in_stack_fffffffffffffe70);
  ImVector<char>::ImVector((ImVector<char> *)(in_RDI + 0x5338));
  ImVector<unsigned_int>::ImVector((ImVector<unsigned_int> *)(in_RDI + 0x5348));
  ImGuiPlatformImeData::ImGuiPlatformImeData((ImGuiPlatformImeData *)in_stack_fffffffffffffe70);
  ImGuiPlatformImeData::ImGuiPlatformImeData((ImGuiPlatformImeData *)in_stack_fffffffffffffe70);
  this_00 = (ImFontAtlas *)(in_RDI + 0x5380);
  ImGuiTextBuffer::ImGuiTextBuffer((ImGuiTextBuffer *)0x13e2ef);
  ImVector<ImGuiSettingsHandler>::ImVector((ImVector<ImGuiSettingsHandler> *)(in_RDI + 0x5390));
  ImChunkStream<ImGuiWindowSettings>::ImChunkStream((ImChunkStream<ImGuiWindowSettings> *)0x13e325);
  ImChunkStream<ImGuiTableSettings>::ImChunkStream((ImChunkStream<ImGuiTableSettings> *)0x13e340);
  ImVector<ImGuiContextHook>::ImVector((ImVector<ImGuiContextHook> *)(in_RDI + 0x53c0));
  ImGuiTextBuffer::ImGuiTextBuffer((ImGuiTextBuffer *)0x13e376);
  ImGuiMetricsConfig::ImGuiMetricsConfig((ImGuiMetricsConfig *)(in_RDI + 0x5424));
  ImGuiStackTool::ImGuiStackTool((ImGuiStackTool *)in_stack_fffffffffffffe70);
  *in_RDI = 0;
  in_RDI[1] = -(local_10 == (void *)0x0) & 1;
  *(undefined8 *)(in_RDI + 0x3c10) = 0;
  *(undefined4 *)(in_RDI + 0x3c1c) = 0;
  *(undefined4 *)(in_RDI + 0x3c18) = 0;
  local_31 = 0;
  if (local_10 == (void *)0x0) {
    pvVar1 = ImGui::MemAlloc((size_t)in_stack_fffffffffffffe70);
    local_188 = operator_new(0x490);
    local_31 = 1;
    local_30 = pvVar1;
    local_28 = local_188;
    ImFontAtlas::ImFontAtlas(this_00);
  }
  else {
    local_188 = local_10;
  }
  *(void **)(in_RDI + 0x50) = local_188;
  *(undefined8 *)(in_RDI + 0x3e20) = 0;
  *(undefined4 *)(in_RDI + 0x3e28) = 0;
  *(undefined4 *)(in_RDI + 0x3e30) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x3e2c) = 0xffffffff;
  in_RDI[0x3e36] = 0;
  in_RDI[0x3e35] = 0;
  in_RDI[0x3e34] = 0;
  in_RDI[0x3e37] = 0;
  in_RDI[0x3e38] = 0;
  *(undefined8 *)(in_RDI + 0x3e40) = 0;
  *(undefined4 *)(in_RDI + 0x3e98) = 0;
  *(undefined8 *)(in_RDI + 0x3ea8) = 0;
  *(undefined8 *)(in_RDI + 0x3eb0) = 0;
  *(undefined8 *)(in_RDI + 0x3eb8) = 0;
  *(undefined8 *)(in_RDI + 0x3ec0) = 0;
  *(undefined8 *)(in_RDI + 0x3ec8) = 0;
  *(undefined4 *)(in_RDI + 0x3ed8) = 0;
  *(undefined4 *)(in_RDI + 0x3edc) = 0;
  *(undefined4 *)(in_RDI + 0x3ee4) = 0;
  *(undefined4 *)(in_RDI + 0x3ee0) = 0;
  in_RDI[0x3ee8] = 0;
  in_RDI[0x3eea] = 0;
  in_RDI[0x3ee9] = 0;
  in_RDI[0x3eeb] = 0;
  *(undefined4 *)(in_RDI + 0x3ef0) = 0;
  *(undefined4 *)(in_RDI + 0x3eec) = 0;
  *(undefined4 *)(in_RDI + 0x3ef4) = 0;
  *(undefined4 *)(in_RDI + 0x3ef8) = 0;
  *(undefined4 *)(in_RDI + 0x3efc) = 0;
  in_RDI[0x3f00] = 0;
  in_RDI[0x3f01] = 0;
  in_RDI[0x3f02] = 0;
  in_RDI[0x3f03] = 0;
  in_RDI[0x3f04] = 0;
  in_RDI[0x3f05] = 0;
  in_RDI[0x3f06] = 0;
  *(undefined4 *)(in_RDI + 0x3f08) = 0;
  *(undefined4 *)(in_RDI + 0x3f0c) = 0;
  ImBitArray<133,_-512>::ClearAllBits((ImBitArray<133,__512> *)0x13e5d9);
  ImVec2::ImVec2(&local_3c,-1.0,-1.0);
  *(ImVec2 *)(in_RDI + 0x3f24) = local_3c;
  *(undefined8 *)(in_RDI + 0x3f30) = 0;
  *(undefined4 *)(in_RDI + 0x3f38) = 0;
  *(undefined4 *)(in_RDI + 0x3f3c) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x3f40) = 0;
  in_RDI[0x3f44] = 0;
  in_RDI[0x3f45] = 0;
  *(undefined8 *)(in_RDI + 0x3f48) = 0;
  *(undefined4 *)(in_RDI + 0x3f50) = 0;
  *(undefined4 *)(in_RDI + 0x3f54) = 0;
  *(undefined4 *)(in_RDI + 0x3f58) = 0;
  *(undefined4 *)(in_RDI + 0x40a0) = 0;
  *(undefined8 *)(in_RDI + 0x40b8) = 0;
  *(undefined4 *)(in_RDI + 0x40d4) = 0;
  *(undefined4 *)(in_RDI + 0x40d0) = 0;
  *(undefined4 *)(in_RDI + 0x40cc) = 0;
  *(undefined4 *)(in_RDI + 0x40c8) = 0;
  *(undefined4 *)(in_RDI + 0x40c4) = 0;
  *(undefined4 *)(in_RDI + 0x40c0) = 0;
  *(undefined4 *)(in_RDI + 0x40e8) = 0;
  *(undefined4 *)(in_RDI + 0x40e0) = 0;
  *(undefined4 *)(in_RDI + 0x40dc) = 0;
  *(undefined4 *)(in_RDI + 0x40ec) = 0;
  *(undefined4 *)(in_RDI + 0x40d8) = 0;
  *(undefined4 *)(in_RDI + 0x40e4) = 0;
  *(undefined4 *)(in_RDI + 0x40f0) = 0;
  *(undefined4 *)(in_RDI + 0x40f4) = 0;
  in_RDI[0x40f8] = 0;
  in_RDI[0x40f9] = 0;
  in_RDI[0x40fa] = 1;
  in_RDI[0x40fb] = 0;
  in_RDI[0x40fc] = 0;
  in_RDI[0x40fd] = 0;
  in_RDI[0x40fe] = 0;
  *(undefined4 *)(in_RDI + 0x4100) = 0;
  in_RDI[0x4114] = 0;
  in_RDI[0x4115] = 0;
  in_RDI[0x4116] = 0;
  *(undefined4 *)(in_RDI + 0x4118) = 0;
  *(undefined4 *)(in_RDI + 0x411c) = 0;
  *(undefined4 *)(in_RDI + 0x4120) = 0;
  *(undefined4 *)(in_RDI + 0x412c) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x4128) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x4124) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x4150) = 0;
  *(undefined4 *)(in_RDI + 0x4154) = 0;
  *(undefined4 *)(in_RDI + 0x4158) = 0;
  *(undefined8 *)(in_RDI + 0x4230) = 0;
  *(undefined8 *)(in_RDI + 0x4228) = 0;
  *(undefined8 *)(in_RDI + 0x4220) = 0;
  *(undefined4 *)(in_RDI + 0x423c) = 0;
  *(undefined4 *)(in_RDI + 0x4238) = 0;
  in_RDI[0x4240] = 0;
  *(undefined4 *)(in_RDI + 0x4244) = 0;
  *(undefined4 *)(in_RDI + 0x4248) = 0;
  in_RDI[0x424e] = 0;
  in_RDI[0x424d] = 0;
  in_RDI[0x424c] = 0;
  *(undefined4 *)(in_RDI + 0x4250) = 0;
  *(undefined4 *)(in_RDI + 0x4254) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x4258) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x42b0) = 0;
  *(undefined4 *)(in_RDI + 0x42b4) = 0;
  *(undefined4 *)(in_RDI + 0x42b8) = 0;
  *(undefined4 *)(in_RDI + 0x42bc) = 0;
  *(undefined4 *)(in_RDI + 0x42c0) = 0;
  *(undefined4 *)(in_RDI + 0x42c4) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x42c8) = 0;
  *(undefined8 *)(in_RDI + 0x42e0) = 0;
  *(undefined8 *)(in_RDI + 0x42e8) = 0;
  *(undefined4 *)(in_RDI + 0x42f0) = 0;
  *(undefined8 *)(in_RDI + 0x4308) = 0;
  *(undefined4 *)(in_RDI + 0x4310) = 0;
  *(undefined8 *)(in_RDI + 0x4370) = 0;
  *(undefined4 *)(in_RDI + 0x52c0) = 0;
  *(undefined4 *)(in_RDI + 0x52c4) = 0xa900000;
  *(undefined4 *)(in_RDI + 0x52cc) = 0;
  *(undefined4 *)(in_RDI + 0x52c8) = 0;
  *(undefined4 *)(in_RDI + 0x52d0) = 0;
  *(undefined4 *)(in_RDI + 0x5314) = 0;
  in_RDI[0x5318] = 0;
  in_RDI[0x5319] = 0;
  *(undefined4 *)(in_RDI + 0x531c) = 0;
  *(undefined4 *)(in_RDI + 0x5320) = 0x3c23d70a;
  *(undefined4 *)(in_RDI + 0x5328) = 0;
  *(undefined2 *)(in_RDI + 0x532c) = 0;
  *(undefined4 *)(in_RDI + 0x5324) = 0;
  *(undefined2 *)(in_RDI + 0x532e) = 0;
  *(undefined4 *)(in_RDI + 0x5330) = 0x3f000000;
  ImVec2::ImVec2(&local_44,0.0,0.0);
  *(ImVec2 *)(in_RDI + 0x535c) = local_44;
  ImVec2::ImVec2(&local_4c,-1.0,-1.0);
  *(ImVec2 *)(in_RDI + 0x536c) = local_4c;
  in_RDI[0x5378] = 0x2e;
  in_RDI[0x5379] = 0;
  *(undefined4 *)(in_RDI + 0x537c) = 0;
  *(undefined4 *)(in_RDI + 0x53d0) = 0;
  in_RDI[0x53d4] = 0;
  *(undefined4 *)(in_RDI + 0x53d8) = 0;
  *(undefined8 *)(in_RDI + 0x5400) = 0;
  *(undefined8 *)(in_RDI + 0x53f8) = 0;
  *(undefined8 *)(in_RDI + 0x53e0) = 0;
  *(undefined4 *)(in_RDI + 0x5408) = 0x7f7fffff;
  in_RDI[0x540c] = 0;
  *(undefined4 *)(in_RDI + 0x5410) = 0;
  *(undefined4 *)(in_RDI + 0x5418) = 2;
  *(undefined4 *)(in_RDI + 0x5414) = 2;
  in_RDI[0x541c] = 0;
  *(undefined4 *)(in_RDI + 0x5420) = 0;
  memset(in_RDI + 0x5460,0,0x1e0);
  *(undefined4 *)(in_RDI + 0x5644) = 0;
  *(undefined4 *)(in_RDI + 0x5640) = 0;
  *(undefined4 *)(in_RDI + 0x5648) = 0;
  *(undefined4 *)(in_RDI + 0x5654) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x5650) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x564c) = 0xffffffff;
  memset(in_RDI + 0x5658,0,0xc01);
  return;
}

Assistant:

ImGuiContext(ImFontAtlas* shared_font_atlas)
    {
        Initialized = false;
        FontAtlasOwnedByContext = shared_font_atlas ? false : true;
        Font = NULL;
        FontSize = FontBaseSize = 0.0f;
        IO.Fonts = shared_font_atlas ? shared_font_atlas : IM_NEW(ImFontAtlas)();
        Time = 0.0f;
        FrameCount = 0;
        FrameCountEnded = FrameCountRendered = -1;
        WithinFrameScope = WithinFrameScopeWithImplicitWindow = WithinEndChild = false;
        GcCompactAll = false;
        TestEngineHookItems = false;
        TestEngine = NULL;

        WindowsActiveCount = 0;
        CurrentWindow = NULL;
        HoveredWindow = NULL;
        HoveredWindowUnderMovingWindow = NULL;
        MovingWindow = NULL;
        WheelingWindow = NULL;
        WheelingWindowTimer = 0.0f;

        DebugHookIdInfo = 0;
        HoveredId = HoveredIdPreviousFrame = 0;
        HoveredIdAllowOverlap = false;
        HoveredIdUsingMouseWheel = HoveredIdPreviousFrameUsingMouseWheel = false;
        HoveredIdDisabled = false;
        HoveredIdTimer = HoveredIdNotActiveTimer = 0.0f;
        ActiveId = 0;
        ActiveIdIsAlive = 0;
        ActiveIdTimer = 0.0f;
        ActiveIdIsJustActivated = false;
        ActiveIdAllowOverlap = false;
        ActiveIdNoClearOnFocusLoss = false;
        ActiveIdHasBeenPressedBefore = false;
        ActiveIdHasBeenEditedBefore = false;
        ActiveIdHasBeenEditedThisFrame = false;
        ActiveIdUsingMouseWheel = false;
        ActiveIdUsingNavDirMask = 0x00;
        ActiveIdUsingNavInputMask = 0x00;
        ActiveIdUsingKeyInputMask.ClearAllBits();
        ActiveIdClickOffset = ImVec2(-1, -1);
        ActiveIdWindow = NULL;
        ActiveIdSource = ImGuiInputSource_None;
        ActiveIdMouseButton = -1;
        ActiveIdPreviousFrame = 0;
        ActiveIdPreviousFrameIsAlive = false;
        ActiveIdPreviousFrameHasBeenEditedBefore = false;
        ActiveIdPreviousFrameWindow = NULL;
        LastActiveId = 0;
        LastActiveIdTimer = 0.0f;

        CurrentItemFlags = ImGuiItemFlags_None;
        BeginMenuCount = 0;

        NavWindow = NULL;
        NavId = NavFocusScopeId = NavActivateId = NavActivateDownId = NavActivatePressedId = NavActivateInputId = 0;
        NavJustMovedToId = NavJustMovedToFocusScopeId = NavNextActivateId = 0;
        NavActivateFlags = NavNextActivateFlags = ImGuiActivateFlags_None;
        NavJustMovedToKeyMods = ImGuiKeyModFlags_None;
        NavInputSource = ImGuiInputSource_None;
        NavLayer = ImGuiNavLayer_Main;
        NavIdIsAlive = false;
        NavMousePosDirty = false;
        NavDisableHighlight = true;
        NavDisableMouseHover = false;
        NavAnyRequest = false;
        NavInitRequest = false;
        NavInitRequestFromMove = false;
        NavInitResultId = 0;
        NavMoveSubmitted = false;
        NavMoveScoringItems = false;
        NavMoveForwardToNextFrame = false;
        NavMoveFlags = ImGuiNavMoveFlags_None;
        NavMoveScrollFlags = ImGuiScrollFlags_None;
        NavMoveKeyMods = ImGuiKeyModFlags_None;
        NavMoveDir = NavMoveDirForDebug = NavMoveClipDir = ImGuiDir_None;
        NavScoringDebugCount = 0;
        NavTabbingDir = 0;
        NavTabbingCounter = 0;

        NavWindowingTarget = NavWindowingTargetAnim = NavWindowingListWindow = NULL;
        NavWindowingTimer = NavWindowingHighlightAlpha = 0.0f;
        NavWindowingToggleLayer = false;

        DimBgRatio = 0.0f;
        MouseCursor = ImGuiMouseCursor_Arrow;

        DragDropActive = DragDropWithinSource = DragDropWithinTarget = false;
        DragDropSourceFlags = ImGuiDragDropFlags_None;
        DragDropSourceFrameCount = -1;
        DragDropMouseButton = -1;
        DragDropTargetId = 0;
        DragDropAcceptFlags = ImGuiDragDropFlags_None;
        DragDropAcceptIdCurrRectSurface = 0.0f;
        DragDropAcceptIdPrev = DragDropAcceptIdCurr = 0;
        DragDropAcceptFrameCount = -1;
        DragDropHoldJustPressedId = 0;
        memset(DragDropPayloadBufLocal, 0, sizeof(DragDropPayloadBufLocal));

        ClipperTempDataStacked = 0;

        CurrentTable = NULL;
        TablesTempDataStacked = 0;
        CurrentTabBar = NULL;

        TempInputId = 0;
        ColorEditOptions = ImGuiColorEditFlags_DefaultOptions_;
        ColorEditLastHue = ColorEditLastSat = 0.0f;
        ColorEditLastColor = 0;
        SliderCurrentAccum = 0.0f;
        SliderCurrentAccumDirty = false;
        DragCurrentAccumDirty = false;
        DragCurrentAccum = 0.0f;
        DragSpeedDefaultRatio = 1.0f / 100.0f;
        DisabledAlphaBackup = 0.0f;
        DisabledStackSize = 0;
        ScrollbarClickDeltaToGrabCenter = 0.0f;
        TooltipOverrideCount = 0;
        TooltipSlowDelay = 0.50f;

        PlatformImeData.InputPos = ImVec2(0.0f, 0.0f);
        PlatformImeDataPrev.InputPos = ImVec2(-1.0f, -1.0f); // Different to ensure initial submission
        PlatformLocaleDecimalPoint = '.';

        SettingsLoaded = false;
        SettingsDirtyTimer = 0.0f;
        HookIdNext = 0;

        LogEnabled = false;
        LogType = ImGuiLogType_None;
        LogNextPrefix = LogNextSuffix = NULL;
        LogFile = NULL;
        LogLinePosY = FLT_MAX;
        LogLineFirstItem = false;
        LogDepthRef = 0;
        LogDepthToExpand = LogDepthToExpandDefault = 2;

        DebugItemPickerActive = false;
        DebugItemPickerBreakId = 0;

        memset(FramerateSecPerFrame, 0, sizeof(FramerateSecPerFrame));
        FramerateSecPerFrameIdx = FramerateSecPerFrameCount = 0;
        FramerateSecPerFrameAccum = 0.0f;
        WantCaptureMouseNextFrame = WantCaptureKeyboardNextFrame = WantTextInputNextFrame = -1;
        memset(TempBuffer, 0, sizeof(TempBuffer));
    }